

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr64.cpp
# Opt level: O1

void __thiscall
icu_63::UVector64::UVector64(UVector64 *this,int32_t initialCapacity,UErrorCode *status)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__UVector64_00403160;
  this->count = 0;
  this->capacity = 0;
  this->maxCapacity = 0;
  this->elements = (int64_t *)0x0;
  _init(this,initialCapacity,status);
  return;
}

Assistant:

UVector64::UVector64(int32_t initialCapacity, UErrorCode &status) :
    count(0),
    capacity(0),
    maxCapacity(0),
    elements(0)
{
    _init(initialCapacity, status);
}